

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_attr(lyd_node *parent,char *module_name,char *name,char *value,lyd_attr **attr)

{
  size_t name_len_00;
  size_t prefix_len;
  char *prefix_00;
  char *ctx_00;
  lyd_attr **value_00;
  char *name_00;
  char *module_key;
  char *parent_00;
  LY_ERR LVar1;
  int iVar2;
  size_t value_len;
  ly_ctx *local_98;
  size_t sStack_88;
  LY_ERR ret__;
  size_t mod_len;
  size_t name_len;
  size_t pref_len;
  char *tmp;
  char *prefix;
  ly_ctx *ctx;
  lyd_attr *ret;
  lyd_attr **attr_local;
  char *value_local;
  char *name_local;
  char *module_name_local;
  lyd_node *parent_local;
  
  ctx = (ly_ctx *)0x0;
  ret = (lyd_attr *)attr;
  attr_local = (lyd_attr **)value;
  value_local = name;
  name_local = module_name;
  module_name_local = (char *)parent;
  if (parent == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent","lyd_new_attr");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (parent->schema == (lysc_node *)0x0) {
    if (name == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_attr");
      parent_local._4_4_ = LY_EINVAL;
    }
    else {
      if (parent->schema == (lysc_node *)0x0) {
        local_98 = (ly_ctx *)parent[2].schema;
      }
      else {
        local_98 = parent->schema->module->ctx;
      }
      prefix = (char *)local_98;
      pref_len = (size_t)name;
      LVar1 = ly_parse_nodeid((char **)&pref_len,&tmp,&name_len,&value_local,&mod_len);
      if ((LVar1 == LY_SUCCESS) && (*(char *)pref_len == '\0')) {
        if ((name_len == 3) && (iVar2 = strncmp(tmp,"xml",3), iVar2 == 0)) {
          value_local = tmp;
          mod_len = name_len + 1 + mod_len;
          tmp = (char *)0x0;
          name_len = 0;
        }
        if (name_local == (char *)0x0) {
          name_local = tmp;
          sStack_88 = name_len;
        }
        else {
          sStack_88 = strlen(name_local);
        }
        parent_00 = module_name_local;
        module_key = name_local;
        name_00 = value_local;
        ctx_00 = prefix;
        prefix_00 = tmp;
        prefix_len = name_len;
        name_len_00 = mod_len;
        if (attr_local == (lyd_attr **)0x0) {
          attr_local = (lyd_attr **)0x254298;
        }
        value_00 = attr_local;
        value_len = strlen((char *)attr_local);
        parent_local._4_4_ =
             lyd_create_attr((lyd_node *)parent_00,(lyd_attr **)&ctx,(ly_ctx *)ctx_00,name_00,
                             name_len_00,prefix_00,prefix_len,module_key,sStack_88,(char *)value_00,
                             value_len,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x3f3);
        if (parent_local._4_4_ == LY_SUCCESS) {
          if (ret != (lyd_attr *)0x0) {
            ret->parent = (lyd_node_opaq *)ctx;
          }
          parent_local._4_4_ = LY_SUCCESS;
        }
      }
      else {
        ly_log((ly_ctx *)prefix,LY_LLERR,LY_EINVAL,"Attribute name \"%s\" is not valid.",value_local
              );
        parent_local._4_4_ = LY_EVALID;
      }
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!parent->schema",
           "lyd_new_attr");
    parent_local._4_4_ = LY_EINVAL;
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_attr(struct lyd_node *parent, const char *module_name, const char *name, const char *value,
        struct lyd_attr **attr)
{
    struct lyd_attr *ret = NULL;
    const struct ly_ctx *ctx;
    const char *prefix, *tmp;
    size_t pref_len, name_len, mod_len;

    LY_CHECK_ARG_RET(NULL, parent, !parent->schema, name, LY_EINVAL);

    ctx = LYD_CTX(parent);

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Attribute name \"%s\" is not valid.", name);
        return LY_EVALID;
    }

    if ((pref_len == 3) && !strncmp(prefix, "xml", 3)) {
        /* not a prefix but special name */
        name = prefix;
        name_len += 1 + pref_len;
        prefix = NULL;
        pref_len = 0;
    }

    /* get the module */
    if (module_name) {
        mod_len = strlen(module_name);
    } else {
        module_name = prefix;
        mod_len = pref_len;
    }

    /* set value if none */
    if (!value) {
        value = "";
    }

    LY_CHECK_RET(lyd_create_attr(parent, &ret, ctx, name, name_len, prefix, pref_len, module_name, mod_len, value,
            strlen(value), NULL, LY_VALUE_JSON, NULL, LYD_HINT_DATA));

    if (attr) {
        *attr = ret;
    }
    return LY_SUCCESS;
}